

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtriangulatingstroker.cpp
# Opt level: O2

void __thiscall QTriangulatingStroker::moveTo(QTriangulatingStroker *this,qreal *pts)

{
  long lVar1;
  long lVar2;
  long lVar3;
  double dVar4;
  double dVar5;
  long lVar6;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  long in_FS_OFFSET;
  float x;
  float y;
  float fVar11;
  float fVar12;
  QVarLengthArray<float,_256LL> local_440;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  dVar4 = *pts;
  dVar5 = pts[1];
  *(ulong *)(this + 0x18) = CONCAT44((float)dVar5,(float)dVar4);
  normalVector(this,(float)dVar4,(float)dVar5,(float)pts[2],(float)pts[3],(float *)(this + 0x20),
               (float *)(this + 0x24));
  lVar2 = *(long *)(this + 8);
  iVar7 = *(int *)(this + 100);
  if (iVar7 == 0x20) {
    memset(&local_440.super_QVLAStorage<4UL,_4UL,_256LL>,0xaa,0x400);
    local_440.super_QVLABase<float>.super_QVLABaseBase.a = 0x100;
    local_440.super_QVLABase<float>.super_QVLABaseBase.s = 0;
    fVar12 = *(float *)(this + 0x18);
    fVar11 = *(float *)(this + 0x1c);
    local_440.super_QVLABase<float>.super_QVLABaseBase.ptr =
         &local_440.super_QVLAStorage<4UL,_4UL,_256LL>;
    arcPoints(this,fVar12,fVar11,fVar12 + *(float *)(this + 0x20),fVar11 + *(float *)(this + 0x24),
              fVar12 - *(float *)(this + 0x20),fVar11 - *(float *)(this + 0x24),&local_440);
    QDataBuffer<float>::resize
              ((QDataBuffer<float> *)this,
               (ulong)((uint)(lVar2 != 0) * 2) + *(long *)(this + 8) +
               local_440.super_QVLABase<float>.super_QVLABaseBase.s);
    iVar7 = *(int *)(this + 8);
    lVar3 = *(long *)(this + 0x10);
    uVar8 = (ulong)(int)(local_440.super_QVLABase<float>.super_QVLABaseBase.s / 2);
    lVar1 = lVar3 + (long)iVar7 * 4;
    lVar6 = 0;
    uVar9 = uVar8;
    for (uVar10 = 0; uVar10 != (uVar9 & 0xffffffff); uVar10 = uVar10 + 1) {
      *(undefined4 *)(lVar1 + -4 + lVar6 * 4) =
           *(undefined4 *)
            ((char *)local_440.super_QVLABase<float>.super_QVLABaseBase.ptr +
            lVar6 * 2 + uVar8 * 8 + -4);
      *(undefined4 *)(lVar1 + -8 + lVar6 * 4) =
           *(undefined4 *)
            ((char *)local_440.super_QVLABase<float>.super_QVLABaseBase.ptr +
            lVar6 * 2 + uVar8 * 8 + -8);
      if (uVar10 == (int)uVar9 - 1) {
        iVar7 = iVar7 + (int)lVar6 + -2;
        goto LAB_003df695;
      }
      *(undefined4 *)(lVar1 + -0xc + lVar6 * 4) =
           *(undefined4 *)
            ((char *)local_440.super_QVLABase<float>.super_QVLABaseBase.ptr + uVar10 * 8 + 4);
      *(undefined4 *)(lVar1 + -0x10 + lVar6 * 4) =
           *(undefined4 *)
            ((char *)local_440.super_QVLABase<float>.super_QVLABaseBase.ptr + uVar10 * 8);
      lVar6 = lVar6 + -4;
      uVar9 = uVar9 - 1;
    }
    iVar7 = iVar7 + (int)lVar6;
LAB_003df695:
    if (lVar2 != 0) {
      *(undefined8 *)(lVar3 + -8 + (long)iVar7 * 4) = *(undefined8 *)(lVar3 + (long)iVar7 * 4);
    }
    QVarLengthArray<float,_256LL>::~QVarLengthArray(&local_440);
  }
  else if (iVar7 == 0x10) {
    fVar12 = *(float *)(this + 0x24);
    fVar11 = *(float *)(this + 0x20);
    x = *(float *)(this + 0x18) - fVar12;
    y = *(float *)(this + 0x1c) + fVar11;
    if (lVar2 != 0) {
      local_440.super_QVLABase<float>.super_QVLABaseBase.a._0_4_ = fVar11 + x;
      QDataBuffer<float>::add((QDataBuffer<float> *)this,(float *)&local_440);
      local_440.super_QVLABase<float>.super_QVLABaseBase.a =
           CONCAT44(local_440.super_QVLABase<float>.super_QVLABaseBase.a._4_4_,
                    *(float *)(this + 0x24) + y);
      QDataBuffer<float>::add((QDataBuffer<float> *)this,(float *)&local_440);
      fVar11 = *(float *)(this + 0x20);
      fVar12 = *(float *)(this + 0x24);
    }
    emitLineSegment(this,x,y,fVar11,fVar12);
  }
  else if ((iVar7 == 0) && (lVar2 != 0)) {
    local_440.super_QVLABase<float>.super_QVLABaseBase.a._0_4_ =
         *(float *)(this + 0x18) + *(float *)(this + 0x20);
    QDataBuffer<float>::add((QDataBuffer<float> *)this,(float *)&local_440);
    local_440.super_QVLABase<float>.super_QVLABaseBase.a =
         CONCAT44(local_440.super_QVLABase<float>.super_QVLABaseBase.a._4_4_,
                  *(float *)(this + 0x1c) + *(float *)(this + 0x24));
    QDataBuffer<float>::add((QDataBuffer<float> *)this,(float *)&local_440);
  }
  emitLineSegment(this,*(float *)(this + 0x18),*(float *)(this + 0x1c),*(float *)(this + 0x20),
                  *(float *)(this + 0x24));
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTriangulatingStroker::moveTo(const qreal *pts)
{
    m_cx = pts[0];
    m_cy = pts[1];

    float x2 = pts[2];
    float y2 = pts[3];
    normalVector(m_cx, m_cy, x2, y2, &m_nvx, &m_nvy);


    // To achieve jumps we insert zero-area tringles. This is done by
    // adding two identical points in both the end of previous strip
    // and beginning of next strip
    bool invisibleJump = m_vertices.size();

    switch (m_cap_style) {
    case Qt::FlatCap:
        if (invisibleJump) {
            m_vertices.add(m_cx + m_nvx);
            m_vertices.add(m_cy + m_nvy);
        }
        break;
    case Qt::SquareCap: {
        float sx = m_cx - m_nvy;
        float sy = m_cy + m_nvx;
        if (invisibleJump) {
            m_vertices.add(sx + m_nvx);
            m_vertices.add(sy + m_nvy);
        }
        emitLineSegment(sx, sy, m_nvx, m_nvy);
        break; }
    case Qt::RoundCap: {
        QVarLengthArray<float> points;
        arcPoints(m_cx, m_cy, m_cx + m_nvx, m_cy + m_nvy, m_cx - m_nvx, m_cy - m_nvy, points);
        m_vertices.resize(m_vertices.size() + points.size() + 2 * int(invisibleJump));
        int count = m_vertices.size();
        int front = 0;
        int end = points.size() / 2;
        while (front != end) {
            m_vertices.at(--count) = points[2 * end - 1];
            m_vertices.at(--count) = points[2 * end - 2];
            --end;
            if (front == end)
                break;
            m_vertices.at(--count) = points[2 * front + 1];
            m_vertices.at(--count) = points[2 * front + 0];
            ++front;
        }

        if (invisibleJump) {
            m_vertices.at(count - 1) = m_vertices.at(count + 1);
            m_vertices.at(count - 2) = m_vertices.at(count + 0);
        }
        break; }
    default: break; // ssssh gcc...
    }
    emitLineSegment(m_cx, m_cy, m_nvx, m_nvy);
}